

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-server-close.c
# Opt level: O2

void pipe_client_connect_cb(uv_connect_t *req,int status)

{
  undefined8 uVar1;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  uv_connect_t *puVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  if (req == &connect_req) {
    req = (uv_connect_t *)(long)status;
    if (req == (uv_connect_t *)0x0) {
      pipe_client_connect_cb_called = pipe_client_connect_cb_called + 1;
      uv_close((uv_handle_t *)&pipe_client,pipe_close_cb);
      uv_close((uv_handle_t *)&pipe_server,pipe_close_cb);
      return;
    }
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar2 = "status";
    uVar1 = 0x2e;
    puVar4 = (uv_connect_t *)0x0;
    pcVar3 = "0";
  }
  else {
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar2 = "req";
    uVar1 = 0x2d;
    puVar4 = &connect_req;
    pcVar3 = "&connect_req";
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-server-close.c"
          ,uVar1,pcVar2,"==",pcVar3,req,"==",puVar4);
  abort();
}

Assistant:

static void pipe_client_connect_cb(uv_connect_t* req, int status) {
  ASSERT_PTR_EQ(req, &connect_req);
  ASSERT_OK(status);

  pipe_client_connect_cb_called++;

  uv_close((uv_handle_t*) &pipe_client, pipe_close_cb);
  uv_close((uv_handle_t*) &pipe_server, pipe_close_cb);
}